

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O1

char duckdb::GetInternalCValue<signed_char,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      cVar2 = TryCastCInternal<bool,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_TINYINT:
      cVar2 = TryCastCInternal<signed_char,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_SMALLINT:
      cVar2 = TryCastCInternal<short,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_INTEGER:
      cVar2 = TryCastCInternal<int,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_BIGINT:
      cVar2 = TryCastCInternal<long,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_UTINYINT:
      cVar2 = TryCastCInternal<unsigned_char,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_USMALLINT:
      cVar2 = TryCastCInternal<unsigned_short,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_UINTEGER:
      cVar2 = TryCastCInternal<unsigned_int,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_UBIGINT:
      cVar2 = TryCastCInternal<unsigned_long,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_FLOAT:
      cVar2 = TryCastCInternal<float,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_DOUBLE:
      cVar2 = TryCastCInternal<double,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      cVar2 = TryCastCInternal<duckdb::timestamp_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_DATE:
      cVar2 = TryCastCInternal<duckdb::date_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_TIME:
      cVar2 = TryCastCInternal<duckdb::dtime_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_INTERVAL:
      cVar2 = TryCastCInternal<duckdb::interval_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_HUGEINT:
      cVar2 = TryCastCInternal<duckdb::hugeint_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_VARCHAR:
      cVar2 = TryCastCInternal<char*,signed_char,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return cVar2;
    case DUCKDB_TYPE_DECIMAL:
      cVar2 = TryCastDecimalCInternal<signed_char>(result,col,row);
      return cVar2;
    case DUCKDB_TYPE_UHUGEINT:
      cVar2 = TryCastCInternal<duckdb::uhugeint_t,signed_char,duckdb::TryCast>(result,col,row);
      return cVar2;
    }
  }
  return '\0';
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}